

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O1

void __thiscall
QNetworkAccessManager::setCookieJar(QNetworkAccessManager *this,QNetworkCookieJar *cookieJar)

{
  long lVar1;
  QNetworkCookieJar *pQVar2;
  long lVar3;
  long lVar4;
  
  lVar1 = *(long *)(this + 8);
  *(undefined1 *)(lVar1 + 0xa0) = 1;
  pQVar2 = *(QNetworkCookieJar **)(lVar1 + 0x80);
  if (pQVar2 != cookieJar) {
    if ((pQVar2 != (QNetworkCookieJar *)0x0) &&
       (*(QNetworkAccessManager **)(*(long *)&pQVar2->field_0x8 + 0x10) == this)) {
      (**(code **)(*(long *)pQVar2 + 0x20))();
    }
    *(QNetworkCookieJar **)(lVar1 + 0x80) = cookieJar;
    if (cookieJar != (QNetworkCookieJar *)0x0) {
      lVar3 = QObject::thread();
      lVar4 = QObject::thread();
      if (lVar3 == lVar4) {
        QObject::setParent(*(QObject **)(lVar1 + 0x80));
        return;
      }
    }
  }
  return;
}

Assistant:

void QNetworkAccessManager::setCookieJar(QNetworkCookieJar *cookieJar)
{
    Q_D(QNetworkAccessManager);
    d->cookieJarCreated = true;
    if (d->cookieJar != cookieJar) {
        if (d->cookieJar && d->cookieJar->parent() == this)
            delete d->cookieJar;
        d->cookieJar = cookieJar;
        if (cookieJar && thread() == cookieJar->thread())
            d->cookieJar->setParent(this);
    }
}